

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

gs_expr_t * gs_parse_expr_assignment(gs_parser_t *parser)

{
  gs_token_t *pgVar1;
  anon_union_8_5_f029217d_for_gs_token_3 aVar2;
  gs_token_type gVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  gs_expr_t *pgVar7;
  gs_expr_t *pgVar8;
  gs_expr_t *pgVar9;
  long lVar10;
  gs_token_t token;
  
  pgVar1 = (parser->tokens).data;
  aVar2 = pgVar1[parser->cur_token].field_3;
  pgVar1 = pgVar1 + parser->cur_token;
  gVar3 = pgVar1->type;
  iVar4 = pgVar1->line;
  iVar5 = pgVar1->col;
  uVar6 = *(undefined4 *)&pgVar1->field_0xc;
  pgVar7 = gs_parse_expr_comparison(parser);
  if (parser->error == false) {
    pgVar1 = (parser->tokens).data;
    lVar10 = (long)parser->cur_token;
    if ((pgVar1[lVar10].type == GS_TOKEN_CHAR) && (pgVar1[lVar10].field_3.c == '=')) {
      while( true ) {
        if ((int)lVar10 < (parser->tokens).length) {
          parser->cur_token = (int)lVar10 + 1;
        }
        pgVar8 = gs_parse_expr_assignment(parser);
        if (parser->error != false) break;
        pgVar9 = (gs_expr_t *)gs_parser_alloc(parser,0x40);
        pgVar9->type = GS_EXPR_ASSIGNMENT;
        (pgVar9->token).type = gVar3;
        (pgVar9->token).line = iVar4;
        (pgVar9->token).col = iVar5;
        *(undefined4 *)&(pgVar9->token).field_0xc = uVar6;
        (pgVar9->token).field_3 = aVar2;
        (pgVar9->field_2).assignment.left = pgVar7;
        (pgVar9->field_2).binary_op.left = pgVar8;
        pgVar1 = (parser->tokens).data;
        lVar10 = (long)parser->cur_token;
        if (pgVar1[lVar10].type != GS_TOKEN_CHAR) {
          return pgVar9;
        }
        pgVar7 = pgVar9;
        if (pgVar1[lVar10].field_3.c != '=') {
          return pgVar9;
        }
      }
    }
  }
  return pgVar7;
}

Assistant:

static gs_expr_t *gs_parse_expr_assignment(gs_parser_t *parser) {
    gs_token_t token = gs_peek(parser);
    gs_expr_t *expr = gs_parse_expr_comparison(parser);
    if (parser->error) goto cleanup;

    while (true) {
        if (gs_eat_char(parser, '=')) {
            gs_expr_t *right = gs_parse_expr_assignment(parser);
            if (parser->error) goto cleanup;

            expr = gs_expr_assignment_new(parser, token, expr, right);
        }
        else {
            break;
        }
    }

cleanup:
    return expr;
}